

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sign.c
# Opt level: O0

_Bool COSE_Sign_AddSigner(HCOSE_SIGN hSign,HCOSE_SIGNER hSigner,cose_errback *perr)

{
  _Bool _Var1;
  cose_error cVar2;
  cn_cbor_errback local_50;
  cn_cbor_errback cbor_error;
  cn_cbor *pSignersT;
  cn_cbor *pSigners;
  COSE_SignMessage *pSign;
  COSE_SignerInfo *pSigner;
  cose_errback *perr_local;
  HCOSE_SIGNER hSigner_local;
  HCOSE_SIGN hSign_local;
  
  cbor_error.pos = 0;
  cbor_error.err = CN_CBOR_NO_ERROR;
  _Var1 = IsValidSignHandle(hSign);
  if (_Var1) {
    _Var1 = IsValidSignerHandle(hSigner);
    if (_Var1) {
      *(undefined8 *)(hSigner + 0x60) = *(undefined8 *)(hSign + 0x58);
      *(HCOSE_SIGNER *)(hSign + 0x58) = hSigner;
      pSignersT = _COSE_arrayget_int((COSE *)hSign,3);
      if (pSignersT == (cn_cbor *)0x0) {
        cbor_error = (cn_cbor_errback)cn_cbor_array_create(&local_50);
        if (cbor_error == (cn_cbor_errback)0x0) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR(local_50);
            perr->err = cVar2;
          }
          goto LAB_0035072a;
        }
        _Var1 = _COSE_array_replace((COSE *)hSign,(cn_cbor *)cbor_error,3,&local_50);
        if (!_Var1) {
          if (perr != (cose_errback *)0x0) {
            cVar2 = _MapFromCBOR(local_50);
            perr->err = cVar2;
          }
          goto LAB_0035072a;
        }
        pSignersT = (cn_cbor *)cbor_error;
        cbor_error.pos = 0;
        cbor_error.err = CN_CBOR_NO_ERROR;
      }
      _Var1 = cn_cbor_array_append(pSignersT,*(cn_cbor **)(hSigner + 0x18),&local_50);
      if (_Var1) {
        *(int *)(hSigner + 0x10) = *(int *)(hSigner + 0x10) + 1;
        return true;
      }
      if (perr != (cose_errback *)0x0) {
        cVar2 = _MapFromCBOR(local_50);
        perr->err = cVar2;
      }
    }
    else if (perr != (cose_errback *)0x0) {
      perr->err = COSE_ERR_INVALID_HANDLE;
    }
  }
  else if (perr != (cose_errback *)0x0) {
    perr->err = COSE_ERR_INVALID_HANDLE;
  }
LAB_0035072a:
  if (cbor_error == (cn_cbor_errback)0x0) {
    cn_cbor_free((cn_cbor *)0x0);
  }
  return false;
}

Assistant:

bool COSE_Sign_AddSigner(HCOSE_SIGN hSign, HCOSE_SIGNER hSigner, cose_errback * perr)
{
	COSE_SignerInfo * pSigner;
	COSE_SignMessage * pSign;
	cn_cbor * pSigners = NULL;
	cn_cbor * pSignersT = NULL;
#ifdef USE_CBOR_CONTEXT
	cn_cbor_context * context = NULL;
#endif
	cn_cbor_errback cbor_error;

	CHECK_CONDITION(IsValidSignHandle(hSign), COSE_ERR_INVALID_HANDLE);
	CHECK_CONDITION(IsValidSignerHandle(hSigner), COSE_ERR_INVALID_HANDLE);

	pSign = (COSE_SignMessage *)hSign;
	pSigner = (COSE_SignerInfo *)hSigner;

	pSigner->m_signerNext = pSign->m_signerFirst;
	pSign->m_signerFirst = pSigner;

#ifdef USE_CBOR_CONTEXT
	context = &pSign->m_message.m_allocContext;
#endif // USE_CBOR_CONTEXT

	pSigners = _COSE_arrayget_int(&pSign->m_message, INDEX_SIGNERS);
	if (pSigners == NULL) {
		pSignersT = cn_cbor_array_create(CBOR_CONTEXT_PARAM_COMMA &cbor_error);
		CHECK_CONDITION_CBOR(pSignersT != NULL, cbor_error);

		CHECK_CONDITION_CBOR(_COSE_array_replace(&pSign->m_message, pSignersT, INDEX_SIGNERS, CBOR_CONTEXT_PARAM_COMMA &cbor_error), cbor_error);
		pSigners = pSignersT;
		pSignersT = NULL;
	}

	CHECK_CONDITION_CBOR(cn_cbor_array_append(pSigners, pSigner->m_message.m_cbor, &cbor_error), cbor_error);
	pSigner->m_message.m_refCount++;

	return true;

errorReturn:
	if (pSignersT == NULL) CN_CBOR_FREE(pSignersT, context);
	return false;
}